

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expanddims.cpp
# Opt level: O0

int __thiscall
ncnn::ExpandDims::forward(ExpandDims *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  Mat *in_RDX;
  Mat *in_RSI;
  long in_RDI;
  int axis;
  int i;
  int *axes_ptr;
  bool _expand_c;
  bool _expand_d;
  bool _expand_h;
  bool _expand_w;
  int dims;
  int channels;
  int h;
  int w;
  bool local_9a9;
  Allocator *in_stack_fffffffffffff6b8;
  undefined8 in_stack_fffffffffffff6c0;
  int iVar3;
  Mat *pMVar2;
  Mat *in_stack_fffffffffffff6c8;
  Mat *pMVar4;
  Allocator *in_stack_fffffffffffff730;
  int in_stack_fffffffffffff738;
  int in_stack_fffffffffffff73c;
  Mat *in_stack_fffffffffffff740;
  int iVar5;
  Mat *in_stack_fffffffffffff748;
  bool local_841;
  Mat local_840;
  Mat local_7f8;
  void *local_7b0;
  int *local_7a8;
  Allocator *in_stack_fffffffffffff870;
  Mat local_768;
  Mat local_720;
  Mat local_6d8;
  Mat local_690;
  Mat local_648;
  Mat local_600;
  Mat local_5a8;
  int local_560;
  int local_55c;
  long local_558;
  bool local_54c;
  bool local_54b;
  bool local_54a;
  bool local_549;
  int local_548;
  int local_544;
  int local_540;
  int local_53c;
  Mat *local_530;
  int local_514;
  int local_510;
  undefined4 local_50c;
  Mat *local_508;
  Mat *local_500;
  int local_4f0;
  undefined4 local_4ec;
  Mat *local_4e8;
  Mat *local_4e0;
  int local_4d0;
  undefined4 local_4cc;
  Mat *local_4c8;
  Mat *local_4c0;
  int local_4b0;
  undefined4 local_4ac;
  Mat *local_4a8;
  Mat *local_4a0;
  int local_490;
  undefined4 local_48c;
  Mat *local_488;
  Mat *local_480;
  int local_470;
  undefined4 local_46c;
  Mat *local_468;
  Mat *local_460;
  int local_450;
  undefined4 local_44c;
  Mat *local_448;
  Mat *local_440;
  int local_430;
  undefined4 local_42c;
  Mat *local_428;
  Mat *local_420;
  int local_410;
  undefined4 local_40c;
  Mat *local_408;
  Mat *local_400;
  int local_3f0;
  undefined4 local_3ec;
  Mat *local_3e8;
  Mat *local_3e0;
  int local_3d0;
  undefined4 local_3cc;
  Mat *local_3c8;
  Mat *local_3b0;
  Mat *local_3a0;
  Mat *local_390;
  Mat *local_380;
  Mat *local_370;
  Mat *local_360;
  Mat *local_350;
  void **local_340;
  Mat *local_330;
  Mat *local_320;
  long *local_308;
  long *local_300;
  int local_2e8;
  undefined4 local_2e4;
  Mat *local_2e0;
  int local_2c8;
  undefined4 local_2c4;
  Mat *local_2c0;
  int local_2a8;
  undefined4 local_2a4;
  void **local_2a0;
  int local_288;
  undefined4 local_284;
  Mat *local_280;
  int local_268;
  undefined4 local_264;
  Mat *local_260;
  int local_248;
  undefined4 local_244;
  Mat *local_240;
  int local_228;
  undefined4 local_224;
  Mat *local_220;
  int local_208;
  undefined4 local_204;
  Mat *local_200;
  int local_1e8;
  undefined4 local_1e4;
  Mat *local_1e0;
  int local_1c8;
  undefined4 local_1c4;
  Mat *local_1c0;
  int local_1b8;
  undefined4 local_1b4;
  int local_1a8;
  undefined4 local_1a4;
  Mat *local_1a0;
  int local_198;
  undefined4 local_194;
  Mat *local_190;
  int local_188;
  undefined4 local_184;
  Mat *local_180;
  int local_178;
  undefined4 local_174;
  Mat *local_170;
  int local_168;
  undefined4 local_164;
  Mat *local_160;
  int local_158;
  undefined4 local_154;
  Mat *local_150;
  int local_148;
  undefined4 local_144;
  Mat *local_140;
  int local_138;
  undefined4 local_134;
  Mat *local_130;
  int local_128;
  undefined4 local_124;
  Mat *local_120;
  int local_118;
  undefined4 local_114;
  Mat *local_110;
  void *local_108;
  void *local_100;
  void *local_f8;
  void *local_f0;
  void *local_e8;
  void *local_e0;
  void *local_d8;
  void *local_d0;
  void *local_c8;
  void *local_c0;
  void *local_b8;
  long *local_10;
  
  local_53c = in_RSI->w;
  local_540 = in_RSI->h;
  local_544 = in_RSI->c;
  local_548 = in_RSI->dims;
  local_549 = false;
  local_54a = false;
  local_54b = false;
  local_54c = false;
  local_308 = (long *)(in_RDI + 0xe0);
  local_841 = true;
  if (*local_308 != 0) {
    local_841 = *(long *)(in_RDI + 0x120) * (long)*(int *)(in_RDI + 0x118) == 0;
    local_10 = local_308;
  }
  if (local_841) {
    local_549 = *(int *)(in_RDI + 0xd0) != 0;
    local_54a = *(int *)(in_RDI + 0xd4) != 0;
    local_54b = *(int *)(in_RDI + 0xd8) != 0;
    local_54c = *(int *)(in_RDI + 0xdc) != 0;
  }
  else {
    local_300 = (long *)(in_RDI + 0xe0);
    local_558 = *local_300;
    for (local_55c = 0; local_55c < *(int *)(in_RDI + 0x10c); local_55c = local_55c + 1) {
      local_560 = *(int *)(local_558 + (long)local_55c * 4);
      if (local_560 < 0) {
        local_560 = local_548 + 1 + local_560;
      }
      if ((local_548 == 1) && (local_560 == 0)) {
        local_54a = true;
      }
      if ((local_548 == 1) && (local_560 == 1)) {
        local_549 = true;
      }
      if ((local_548 == 2) && (local_560 == 0)) {
        local_54c = true;
      }
      if ((local_548 == 2) && (local_560 == 1)) {
        local_54a = true;
      }
      if ((local_548 == 2) && (local_560 == 2)) {
        local_549 = true;
      }
      if ((local_548 == 3) && (local_560 == 0)) {
        local_54c = true;
      }
      if ((local_548 == 3) && (local_560 == 1)) {
        local_54b = true;
      }
      if ((local_548 == 3) && (local_560 == 2)) {
        local_54a = true;
      }
      if ((local_548 == 3) && (local_560 == 3)) {
        local_549 = true;
      }
    }
  }
  local_530 = in_RDX;
  if (in_RDX != in_RSI) {
    if (in_RSI->refcount != (int *)0x0) {
      piVar1 = in_RSI->refcount;
      local_3cc = 1;
      LOCK();
      local_3d0 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_3c8 = in_RSI;
    if (in_RDX->refcount != (int *)0x0) {
      piVar1 = in_RDX->refcount;
      local_1b4 = 0xffffffff;
      LOCK();
      local_1b8 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_1b8 == 1) {
        if (in_RDX->allocator == (Allocator *)0x0) {
          local_b8 = in_RDX->data;
          if (local_b8 != (void *)0x0) {
            free(local_b8);
          }
        }
        else {
          (*in_RDX->allocator->_vptr_Allocator[3])(in_RDX->allocator,in_RDX->data);
        }
      }
    }
    in_RDX->data = (void *)0x0;
    in_RDX->elemsize = 0;
    in_RDX->elempack = 0;
    in_RDX->dims = 0;
    in_RDX->w = 0;
    in_RDX->h = 0;
    in_RDX->d = 0;
    in_RDX->c = 0;
    in_RDX->cstep = 0;
    in_RDX->refcount = (int *)0x0;
    in_RDX->data = local_3c8->data;
    in_RDX->refcount = local_3c8->refcount;
    in_RDX->elemsize = local_3c8->elemsize;
    in_RDX->elempack = local_3c8->elempack;
    in_RDX->allocator = local_3c8->allocator;
    in_RDX->dims = local_3c8->dims;
    in_RDX->w = local_3c8->w;
    in_RDX->h = local_3c8->h;
    in_RDX->d = local_3c8->d;
    in_RDX->c = local_3c8->c;
    in_RDX->cstep = local_3c8->cstep;
  }
  if (local_548 == 1) {
    if (((local_549 & 1U) == 0) || ((local_54a & 1U) == 0)) {
      iVar3 = (int)((ulong)in_stack_fffffffffffff6c0 >> 0x20);
      if ((local_549 & 1U) == 0) {
        if ((local_54a & 1U) != 0) {
          Mat::reshape(in_stack_fffffffffffff6c8,iVar3,(int)in_stack_fffffffffffff6c0,
                       in_stack_fffffffffffff6b8);
          pMVar2 = local_530;
          local_420 = local_530;
          local_428 = &local_648;
          if (local_530 != local_428) {
            if (local_648.refcount != (int *)0x0) {
              local_42c = 1;
              LOCK();
              local_430 = *local_648.refcount;
              *local_648.refcount = *local_648.refcount + 1;
              UNLOCK();
            }
            local_180 = local_530;
            in_stack_fffffffffffff748 = local_530;
            if (local_530->refcount != (int *)0x0) {
              piVar1 = local_530->refcount;
              local_184 = 0xffffffff;
              LOCK();
              local_188 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_188 == 1) {
                if (local_530->allocator == (Allocator *)0x0) {
                  local_d0 = local_530->data;
                  if (local_d0 != (void *)0x0) {
                    free(local_d0);
                  }
                }
                else {
                  (*local_530->allocator->_vptr_Allocator[3])(local_530->allocator,local_530->data);
                }
              }
            }
            in_stack_fffffffffffff748->data = (void *)0x0;
            in_stack_fffffffffffff748->elemsize = 0;
            in_stack_fffffffffffff748->elempack = 0;
            in_stack_fffffffffffff748->dims = 0;
            in_stack_fffffffffffff748->w = 0;
            in_stack_fffffffffffff748->h = 0;
            in_stack_fffffffffffff748->d = 0;
            in_stack_fffffffffffff748->c = 0;
            in_stack_fffffffffffff748->cstep = 0;
            in_stack_fffffffffffff748->refcount = (int *)0x0;
            pMVar2->data = local_428->data;
            pMVar2->refcount = local_428->refcount;
            pMVar2->elemsize = local_428->elemsize;
            pMVar2->elempack = local_428->elempack;
            pMVar2->allocator = local_428->allocator;
            pMVar2->dims = local_428->dims;
            pMVar2->w = local_428->w;
            pMVar2->h = local_428->h;
            pMVar2->d = local_428->d;
            pMVar2->c = local_428->c;
            pMVar2->cstep = local_428->cstep;
          }
          in_stack_fffffffffffff740 = &local_648;
          local_390 = in_stack_fffffffffffff740;
          local_200 = in_stack_fffffffffffff740;
          if (local_648.refcount != (int *)0x0) {
            local_204 = 0xffffffff;
            LOCK();
            local_208 = *local_648.refcount;
            *local_648.refcount = *local_648.refcount + -1;
            UNLOCK();
            if (local_208 == 1) {
              if (local_648.allocator == (Allocator *)0x0) {
                if (local_648.data != (void *)0x0) {
                  free(local_648.data);
                }
              }
              else {
                (*(local_648.allocator)->_vptr_Allocator[3])(local_648.allocator,local_648.data);
              }
            }
          }
          in_stack_fffffffffffff740->data = (void *)0x0;
          in_stack_fffffffffffff740->elemsize = 0;
          in_stack_fffffffffffff740->elempack = 0;
          in_stack_fffffffffffff740->dims = 0;
          in_stack_fffffffffffff740->w = 0;
          in_stack_fffffffffffff740->h = 0;
          in_stack_fffffffffffff740->d = 0;
          in_stack_fffffffffffff740->c = 0;
          in_stack_fffffffffffff740->cstep = 0;
          in_stack_fffffffffffff740->refcount = (int *)0x0;
        }
      }
      else {
        Mat::reshape(in_stack_fffffffffffff6c8,iVar3,(int)in_stack_fffffffffffff6c0,
                     in_stack_fffffffffffff6b8);
        pMVar2 = local_530;
        local_400 = local_530;
        local_408 = &local_600;
        if (local_530 != local_408) {
          if (local_600.refcount != (int *)0x0) {
            local_40c = 1;
            LOCK();
            local_410 = *local_600.refcount;
            *local_600.refcount = *local_600.refcount + 1;
            UNLOCK();
          }
          local_190 = local_530;
          if (local_530->refcount != (int *)0x0) {
            piVar1 = local_530->refcount;
            local_194 = 0xffffffff;
            LOCK();
            local_198 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_198 == 1) {
              if (local_530->allocator == (Allocator *)0x0) {
                local_c8 = local_530->data;
                if (local_c8 != (void *)0x0) {
                  free(local_c8);
                }
              }
              else {
                (*local_530->allocator->_vptr_Allocator[3])(local_530->allocator,local_530->data);
              }
            }
          }
          pMVar2->data = (void *)0x0;
          pMVar2->elemsize = 0;
          pMVar2->elempack = 0;
          pMVar2->dims = 0;
          pMVar2->w = 0;
          pMVar2->h = 0;
          pMVar2->d = 0;
          pMVar2->c = 0;
          pMVar2->cstep = 0;
          pMVar2->refcount = (int *)0x0;
          pMVar2->data = local_408->data;
          pMVar2->refcount = local_408->refcount;
          pMVar2->elemsize = local_408->elemsize;
          pMVar2->elempack = local_408->elempack;
          pMVar2->allocator = local_408->allocator;
          pMVar2->dims = local_408->dims;
          pMVar2->w = local_408->w;
          pMVar2->h = local_408->h;
          pMVar2->d = local_408->d;
          pMVar2->c = local_408->c;
          pMVar2->cstep = local_408->cstep;
        }
        local_3a0 = &local_600;
        local_1e0 = local_3a0;
        if (local_600.refcount != (int *)0x0) {
          local_1e4 = 0xffffffff;
          LOCK();
          local_1e8 = *local_600.refcount;
          *local_600.refcount = *local_600.refcount + -1;
          UNLOCK();
          if (local_1e8 == 1) {
            if (local_600.allocator == (Allocator *)0x0) {
              if (local_600.data != (void *)0x0) {
                free(local_600.data);
              }
            }
            else {
              (*(local_600.allocator)->_vptr_Allocator[3])(local_600.allocator,local_600.data);
            }
          }
        }
        local_600.data = (void *)0x0;
        local_600.elemsize = 0;
        local_600.elempack = 0;
        local_600.dims = 0;
        local_600.w = 0;
        local_600.h = 0;
        local_600.d = 0;
        local_600.c = 0;
        local_600.cstep = 0;
        local_600.refcount = (int *)0x0;
      }
    }
    else {
      Mat::reshape(in_stack_fffffffffffff748,(int)((ulong)in_stack_fffffffffffff740 >> 0x20),
                   (int)in_stack_fffffffffffff740,in_stack_fffffffffffff73c,
                   in_stack_fffffffffffff730);
      pMVar2 = local_530;
      local_3e0 = local_530;
      local_3e8 = &local_5a8;
      if (local_530 != local_3e8) {
        if (local_5a8.refcount != (int *)0x0) {
          local_3ec = 1;
          LOCK();
          local_3f0 = *local_5a8.refcount;
          *local_5a8.refcount = *local_5a8.refcount + 1;
          UNLOCK();
        }
        local_1a0 = local_530;
        if (local_530->refcount != (int *)0x0) {
          piVar1 = local_530->refcount;
          local_1a4 = 0xffffffff;
          LOCK();
          local_1a8 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_1a8 == 1) {
            if (local_530->allocator == (Allocator *)0x0) {
              local_c0 = local_530->data;
              if (local_c0 != (void *)0x0) {
                free(local_c0);
              }
            }
            else {
              (*local_530->allocator->_vptr_Allocator[3])(local_530->allocator,local_530->data);
            }
          }
        }
        pMVar2->data = (void *)0x0;
        pMVar2->elemsize = 0;
        pMVar2->elempack = 0;
        pMVar2->dims = 0;
        pMVar2->w = 0;
        pMVar2->h = 0;
        pMVar2->d = 0;
        pMVar2->c = 0;
        pMVar2->cstep = 0;
        pMVar2->refcount = (int *)0x0;
        pMVar2->data = local_3e8->data;
        pMVar2->refcount = local_3e8->refcount;
        pMVar2->elemsize = local_3e8->elemsize;
        pMVar2->elempack = local_3e8->elempack;
        pMVar2->allocator = local_3e8->allocator;
        pMVar2->dims = local_3e8->dims;
        pMVar2->w = local_3e8->w;
        pMVar2->h = local_3e8->h;
        pMVar2->d = local_3e8->d;
        pMVar2->c = local_3e8->c;
        pMVar2->cstep = local_3e8->cstep;
      }
      local_3b0 = &local_5a8;
      local_1c0 = local_3b0;
      if (local_5a8.refcount != (int *)0x0) {
        local_1c4 = 0xffffffff;
        LOCK();
        local_1c8 = *local_5a8.refcount;
        *local_5a8.refcount = *local_5a8.refcount + -1;
        UNLOCK();
        if (local_1c8 == 1) {
          if (local_5a8.allocator == (Allocator *)0x0) {
            if (local_5a8.data != (void *)0x0) {
              free(local_5a8.data);
            }
          }
          else {
            (*(local_5a8.allocator)->_vptr_Allocator[3])(local_5a8.allocator,local_5a8.data);
          }
        }
      }
      local_5a8.data = (void *)0x0;
      local_5a8.elemsize = 0;
      local_5a8.elempack = 0;
      local_5a8.dims = 0;
      local_5a8.w = 0;
      local_5a8.h = 0;
      local_5a8.d = 0;
      local_5a8.c = 0;
      local_5a8.cstep = 0;
      local_5a8.refcount = (int *)0x0;
    }
  }
  if (local_548 == 2) {
    iVar3 = (int)in_stack_fffffffffffff740;
    iVar5 = (int)((ulong)in_stack_fffffffffffff740 >> 0x20);
    if ((local_549 & 1U) == 0) {
      if ((local_54a & 1U) == 0) {
        if ((local_54c & 1U) != 0) {
          Mat::reshape(in_stack_fffffffffffff748,iVar5,iVar3,in_stack_fffffffffffff73c,
                       in_stack_fffffffffffff730);
          pMVar2 = local_530;
          local_480 = local_530;
          local_488 = &local_720;
          if (local_530 != local_488) {
            if (local_720.refcount != (int *)0x0) {
              local_48c = 1;
              LOCK();
              local_490 = *local_720.refcount;
              *local_720.refcount = *local_720.refcount + 1;
              UNLOCK();
            }
            local_150 = local_530;
            if (local_530->refcount != (int *)0x0) {
              piVar1 = local_530->refcount;
              local_154 = 0xffffffff;
              LOCK();
              local_158 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_158 == 1) {
                if (local_530->allocator == (Allocator *)0x0) {
                  local_e8 = local_530->data;
                  if (local_e8 != (void *)0x0) {
                    free(local_e8);
                  }
                }
                else {
                  (*local_530->allocator->_vptr_Allocator[3])(local_530->allocator,local_530->data);
                }
              }
            }
            pMVar2->data = (void *)0x0;
            pMVar2->elemsize = 0;
            pMVar2->elempack = 0;
            pMVar2->dims = 0;
            pMVar2->w = 0;
            pMVar2->h = 0;
            pMVar2->d = 0;
            pMVar2->c = 0;
            pMVar2->cstep = 0;
            pMVar2->refcount = (int *)0x0;
            pMVar2->data = local_488->data;
            pMVar2->refcount = local_488->refcount;
            pMVar2->elemsize = local_488->elemsize;
            pMVar2->elempack = local_488->elempack;
            pMVar2->allocator = local_488->allocator;
            pMVar2->dims = local_488->dims;
            pMVar2->w = local_488->w;
            pMVar2->h = local_488->h;
            pMVar2->d = local_488->d;
            pMVar2->c = local_488->c;
            pMVar2->cstep = local_488->cstep;
          }
          local_360 = &local_720;
          local_260 = local_360;
          if (local_720.refcount != (int *)0x0) {
            local_264 = 0xffffffff;
            LOCK();
            local_268 = *local_720.refcount;
            *local_720.refcount = *local_720.refcount + -1;
            UNLOCK();
            if (local_268 == 1) {
              if (local_720.allocator == (Allocator *)0x0) {
                if (local_720.data != (void *)0x0) {
                  free(local_720.data);
                }
              }
              else {
                (*(local_720.allocator)->_vptr_Allocator[3])(local_720.allocator,local_720.data);
              }
            }
          }
          local_720.data = (void *)0x0;
          local_720.elemsize = 0;
          local_720.elempack = 0;
          local_720.dims = 0;
          local_720.w = 0;
          local_720.h = 0;
          local_720.d = 0;
          local_720.c = 0;
          local_720.cstep = 0;
          local_720.refcount = (int *)0x0;
        }
      }
      else {
        Mat::reshape(in_stack_fffffffffffff748,iVar5,iVar3,in_stack_fffffffffffff73c,
                     in_stack_fffffffffffff730);
        pMVar2 = local_530;
        local_460 = local_530;
        local_468 = &local_6d8;
        if (local_530 != local_468) {
          if (local_6d8.refcount != (int *)0x0) {
            local_46c = 1;
            LOCK();
            local_470 = *local_6d8.refcount;
            *local_6d8.refcount = *local_6d8.refcount + 1;
            UNLOCK();
          }
          local_160 = local_530;
          if (local_530->refcount != (int *)0x0) {
            piVar1 = local_530->refcount;
            local_164 = 0xffffffff;
            LOCK();
            local_168 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_168 == 1) {
              if (local_530->allocator == (Allocator *)0x0) {
                local_e0 = local_530->data;
                if (local_e0 != (void *)0x0) {
                  free(local_e0);
                }
              }
              else {
                (*local_530->allocator->_vptr_Allocator[3])(local_530->allocator,local_530->data);
              }
            }
          }
          pMVar2->data = (void *)0x0;
          pMVar2->elemsize = 0;
          pMVar2->elempack = 0;
          pMVar2->dims = 0;
          pMVar2->w = 0;
          pMVar2->h = 0;
          pMVar2->d = 0;
          pMVar2->c = 0;
          pMVar2->cstep = 0;
          pMVar2->refcount = (int *)0x0;
          pMVar2->data = local_468->data;
          pMVar2->refcount = local_468->refcount;
          pMVar2->elemsize = local_468->elemsize;
          pMVar2->elempack = local_468->elempack;
          pMVar2->allocator = local_468->allocator;
          pMVar2->dims = local_468->dims;
          pMVar2->w = local_468->w;
          pMVar2->h = local_468->h;
          pMVar2->d = local_468->d;
          pMVar2->c = local_468->c;
          pMVar2->cstep = local_468->cstep;
        }
        local_370 = &local_6d8;
        local_240 = local_370;
        if (local_6d8.refcount != (int *)0x0) {
          local_244 = 0xffffffff;
          LOCK();
          local_248 = *local_6d8.refcount;
          *local_6d8.refcount = *local_6d8.refcount + -1;
          UNLOCK();
          if (local_248 == 1) {
            if (local_6d8.allocator == (Allocator *)0x0) {
              if (local_6d8.data != (void *)0x0) {
                free(local_6d8.data);
              }
            }
            else {
              (*(local_6d8.allocator)->_vptr_Allocator[3])(local_6d8.allocator,local_6d8.data);
            }
          }
        }
        local_6d8.data = (void *)0x0;
        local_6d8.elemsize = 0;
        local_6d8.elempack = 0;
        local_6d8.dims = 0;
        local_6d8.w = 0;
        local_6d8.h = 0;
        local_6d8.d = 0;
        local_6d8.c = 0;
        local_6d8.cstep = 0;
        local_6d8.refcount = (int *)0x0;
      }
    }
    else {
      Mat::reshape(in_stack_fffffffffffff748,iVar5,iVar3,in_stack_fffffffffffff73c,
                   in_stack_fffffffffffff730);
      pMVar2 = local_530;
      local_440 = local_530;
      local_448 = &local_690;
      if (local_530 != local_448) {
        if (local_690.refcount != (int *)0x0) {
          local_44c = 1;
          LOCK();
          local_450 = *local_690.refcount;
          *local_690.refcount = *local_690.refcount + 1;
          UNLOCK();
        }
        local_170 = local_530;
        pMVar4 = local_530;
        if (local_530->refcount != (int *)0x0) {
          piVar1 = local_530->refcount;
          local_174 = 0xffffffff;
          LOCK();
          local_178 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_178 == 1) {
            if (local_530->allocator == (Allocator *)0x0) {
              local_d8 = local_530->data;
              if (local_d8 != (void *)0x0) {
                free(local_d8);
              }
            }
            else {
              (*local_530->allocator->_vptr_Allocator[3])(local_530->allocator,local_530->data);
            }
          }
        }
        pMVar2->data = (void *)0x0;
        pMVar2->elemsize = 0;
        pMVar2->elempack = 0;
        pMVar2->dims = 0;
        pMVar2->w = 0;
        pMVar2->h = 0;
        pMVar2->d = 0;
        pMVar2->c = 0;
        pMVar2->cstep = 0;
        pMVar2->refcount = (int *)0x0;
        pMVar4->data = local_448->data;
        pMVar4->refcount = local_448->refcount;
        pMVar4->elemsize = local_448->elemsize;
        pMVar4->elempack = local_448->elempack;
        pMVar4->allocator = local_448->allocator;
        pMVar4->dims = local_448->dims;
        pMVar4->w = local_448->w;
        pMVar4->h = local_448->h;
        pMVar4->d = local_448->d;
        pMVar4->c = local_448->c;
        pMVar4->cstep = local_448->cstep;
      }
      local_380 = &local_690;
      local_220 = local_380;
      if (local_690.refcount != (int *)0x0) {
        local_224 = 0xffffffff;
        LOCK();
        local_228 = *local_690.refcount;
        *local_690.refcount = *local_690.refcount + -1;
        UNLOCK();
        if (local_228 == 1) {
          if (local_690.allocator == (Allocator *)0x0) {
            if (local_690.data != (void *)0x0) {
              free(local_690.data);
            }
          }
          else {
            (*(local_690.allocator)->_vptr_Allocator[3])(local_690.allocator,local_690.data);
          }
        }
      }
      local_690.data = (void *)0x0;
      local_690.elemsize = 0;
      local_690.elempack = 0;
      local_690.dims = 0;
      local_690.w = 0;
      local_690.h = 0;
      local_690.d = 0;
      local_690.c = 0;
      local_690.cstep = 0;
      local_690.refcount = (int *)0x0;
    }
  }
  if (local_548 == 3) {
    iVar3 = (int)in_stack_fffffffffffff740;
    iVar5 = (int)((ulong)in_stack_fffffffffffff740 >> 0x20);
    if ((local_549 & 1U) == 0) {
      if ((local_54a & 1U) == 0) {
        if ((local_54b & 1U) == 0) {
          if ((local_54c & 1U) != 0) {
            Mat::reshape(in_stack_fffffffffffff748,iVar5,iVar3,in_stack_fffffffffffff73c,
                         in_stack_fffffffffffff738,in_stack_fffffffffffff870);
            pMVar2 = local_530;
            local_500 = local_530;
            local_508 = &local_840;
            if (local_530 != local_508) {
              if (local_840.refcount != (int *)0x0) {
                local_50c = 1;
                LOCK();
                local_510 = *local_840.refcount;
                *local_840.refcount = *local_840.refcount + 1;
                UNLOCK();
              }
              local_110 = local_530;
              if (local_530->refcount != (int *)0x0) {
                piVar1 = local_530->refcount;
                local_114 = 0xffffffff;
                LOCK();
                local_118 = *piVar1;
                *piVar1 = *piVar1 + -1;
                UNLOCK();
                if (local_118 == 1) {
                  if (local_530->allocator == (Allocator *)0x0) {
                    local_108 = local_530->data;
                    if (local_108 != (void *)0x0) {
                      free(local_108);
                    }
                  }
                  else {
                    (*local_530->allocator->_vptr_Allocator[3])
                              (local_530->allocator,local_530->data);
                  }
                }
              }
              pMVar2->data = (void *)0x0;
              pMVar2->elemsize = 0;
              pMVar2->elempack = 0;
              pMVar2->dims = 0;
              pMVar2->w = 0;
              pMVar2->h = 0;
              pMVar2->d = 0;
              pMVar2->c = 0;
              pMVar2->cstep = 0;
              pMVar2->refcount = (int *)0x0;
              pMVar2->data = local_508->data;
              pMVar2->refcount = local_508->refcount;
              pMVar2->elemsize = local_508->elemsize;
              pMVar2->elempack = local_508->elempack;
              pMVar2->allocator = local_508->allocator;
              pMVar2->dims = local_508->dims;
              pMVar2->w = local_508->w;
              pMVar2->h = local_508->h;
              pMVar2->d = local_508->d;
              pMVar2->c = local_508->c;
              pMVar2->cstep = local_508->cstep;
            }
            local_320 = &local_840;
            if (local_840.refcount != (int *)0x0) {
              local_2e4 = 0xffffffff;
              LOCK();
              local_2e8 = *local_840.refcount;
              *local_840.refcount = *local_840.refcount + -1;
              UNLOCK();
              if (local_2e8 == 1) {
                local_2e0 = local_320;
                if (local_840.allocator == (Allocator *)0x0) {
                  if (local_840.data != (void *)0x0) {
                    free(local_840.data);
                  }
                }
                else {
                  (*(local_840.allocator)->_vptr_Allocator[3])(local_840.allocator,local_840.data);
                }
              }
            }
          }
        }
        else {
          Mat::reshape(in_stack_fffffffffffff748,iVar5,iVar3,in_stack_fffffffffffff73c,
                       in_stack_fffffffffffff738,in_stack_fffffffffffff870);
          pMVar2 = local_530;
          local_4e0 = local_530;
          local_4e8 = &local_7f8;
          if (local_530 != local_4e8) {
            if (local_7f8.refcount != (int *)0x0) {
              local_4ec = 1;
              LOCK();
              local_4f0 = *local_7f8.refcount;
              *local_7f8.refcount = *local_7f8.refcount + 1;
              UNLOCK();
            }
            local_120 = local_530;
            if (local_530->refcount != (int *)0x0) {
              piVar1 = local_530->refcount;
              local_124 = 0xffffffff;
              LOCK();
              local_128 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_128 == 1) {
                if (local_530->allocator == (Allocator *)0x0) {
                  local_100 = local_530->data;
                  if (local_100 != (void *)0x0) {
                    free(local_100);
                  }
                }
                else {
                  (*local_530->allocator->_vptr_Allocator[3])(local_530->allocator,local_530->data);
                }
              }
            }
            pMVar2->data = (void *)0x0;
            pMVar2->elemsize = 0;
            pMVar2->elempack = 0;
            pMVar2->dims = 0;
            pMVar2->w = 0;
            pMVar2->h = 0;
            pMVar2->d = 0;
            pMVar2->c = 0;
            pMVar2->cstep = 0;
            pMVar2->refcount = (int *)0x0;
            pMVar2->data = local_4e8->data;
            pMVar2->refcount = local_4e8->refcount;
            pMVar2->elemsize = local_4e8->elemsize;
            pMVar2->elempack = local_4e8->elempack;
            pMVar2->allocator = local_4e8->allocator;
            pMVar2->dims = local_4e8->dims;
            pMVar2->w = local_4e8->w;
            pMVar2->h = local_4e8->h;
            pMVar2->d = local_4e8->d;
            pMVar2->c = local_4e8->c;
            pMVar2->cstep = local_4e8->cstep;
          }
          local_330 = &local_7f8;
          if (local_7f8.refcount != (int *)0x0) {
            local_2c4 = 0xffffffff;
            LOCK();
            local_2c8 = *local_7f8.refcount;
            *local_7f8.refcount = *local_7f8.refcount + -1;
            UNLOCK();
            if (local_2c8 == 1) {
              local_2c0 = local_330;
              if (local_7f8.allocator == (Allocator *)0x0) {
                if (local_7f8.data != (void *)0x0) {
                  free(local_7f8.data);
                }
              }
              else {
                (*(local_7f8.allocator)->_vptr_Allocator[3])(local_7f8.allocator,local_7f8.data);
              }
            }
          }
        }
      }
      else {
        Mat::reshape(in_stack_fffffffffffff748,iVar5,iVar3,in_stack_fffffffffffff73c,
                     in_stack_fffffffffffff738,in_stack_fffffffffffff870);
        pMVar2 = local_530;
        local_4c0 = local_530;
        local_4c8 = (Mat *)&local_7b0;
        if (local_530 != local_4c8) {
          if (local_7a8 != (int *)0x0) {
            local_4cc = 1;
            LOCK();
            local_4d0 = *local_7a8;
            *local_7a8 = *local_7a8 + 1;
            UNLOCK();
          }
          local_130 = local_530;
          if (local_530->refcount != (int *)0x0) {
            piVar1 = local_530->refcount;
            local_134 = 0xffffffff;
            LOCK();
            local_138 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_138 == 1) {
              if (local_530->allocator == (Allocator *)0x0) {
                local_f8 = local_530->data;
                if (local_f8 != (void *)0x0) {
                  free(local_f8);
                }
              }
              else {
                (*local_530->allocator->_vptr_Allocator[3])(local_530->allocator,local_530->data);
              }
            }
          }
          pMVar2->data = (void *)0x0;
          pMVar2->elemsize = 0;
          pMVar2->elempack = 0;
          pMVar2->dims = 0;
          pMVar2->w = 0;
          pMVar2->h = 0;
          pMVar2->d = 0;
          pMVar2->c = 0;
          pMVar2->cstep = 0;
          pMVar2->refcount = (int *)0x0;
          pMVar2->data = local_4c8->data;
          pMVar2->refcount = local_4c8->refcount;
          pMVar2->elemsize = local_4c8->elemsize;
          pMVar2->elempack = local_4c8->elempack;
          pMVar2->allocator = local_4c8->allocator;
          pMVar2->dims = local_4c8->dims;
          pMVar2->w = local_4c8->w;
          pMVar2->h = local_4c8->h;
          pMVar2->d = local_4c8->d;
          pMVar2->c = local_4c8->c;
          pMVar2->cstep = local_4c8->cstep;
        }
        local_340 = &local_7b0;
        if (local_7a8 != (int *)0x0) {
          local_2a4 = 0xffffffff;
          LOCK();
          local_2a8 = *local_7a8;
          *local_7a8 = *local_7a8 + -1;
          UNLOCK();
          if (local_2a8 == 1) {
            local_2a0 = local_340;
            if (in_stack_fffffffffffff870 == (Allocator *)0x0) {
              if (local_7b0 != (void *)0x0) {
                free(local_7b0);
              }
            }
            else {
              (*in_stack_fffffffffffff870->_vptr_Allocator[3])(in_stack_fffffffffffff870,local_7b0);
            }
          }
        }
      }
    }
    else {
      Mat::reshape(in_stack_fffffffffffff748,iVar5,iVar3,in_stack_fffffffffffff73c,
                   in_stack_fffffffffffff738,in_stack_fffffffffffff870);
      pMVar2 = local_530;
      local_4a0 = local_530;
      local_4a8 = &local_768;
      if (local_530 != local_4a8) {
        if (local_768.refcount != (int *)0x0) {
          local_4ac = 1;
          LOCK();
          local_4b0 = *local_768.refcount;
          *local_768.refcount = *local_768.refcount + 1;
          UNLOCK();
        }
        local_140 = local_530;
        pMVar4 = local_530;
        if (local_530->refcount != (int *)0x0) {
          piVar1 = local_530->refcount;
          local_144 = 0xffffffff;
          LOCK();
          local_148 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_148 == 1) {
            if (local_530->allocator == (Allocator *)0x0) {
              local_f0 = local_530->data;
              if (local_f0 != (void *)0x0) {
                free(local_f0);
              }
            }
            else {
              (*local_530->allocator->_vptr_Allocator[3])(local_530->allocator,local_530->data);
            }
          }
        }
        pMVar4->data = (void *)0x0;
        pMVar4->elemsize = 0;
        pMVar4->elempack = 0;
        pMVar4->dims = 0;
        pMVar4->w = 0;
        pMVar4->h = 0;
        pMVar4->d = 0;
        pMVar4->c = 0;
        pMVar4->cstep = 0;
        pMVar4->refcount = (int *)0x0;
        pMVar2->data = local_4a8->data;
        pMVar2->refcount = local_4a8->refcount;
        pMVar2->elemsize = local_4a8->elemsize;
        pMVar2->elempack = local_4a8->elempack;
        pMVar2->allocator = local_4a8->allocator;
        pMVar2->dims = local_4a8->dims;
        pMVar2->w = local_4a8->w;
        pMVar2->h = local_4a8->h;
        pMVar2->d = local_4a8->d;
        pMVar2->c = local_4a8->c;
        pMVar2->cstep = local_4a8->cstep;
      }
      pMVar2 = &local_768;
      if (local_768.refcount != (int *)0x0) {
        local_284 = 0xffffffff;
        LOCK();
        local_288 = *local_768.refcount;
        *local_768.refcount = *local_768.refcount + -1;
        UNLOCK();
        if (local_288 == 1) {
          local_350 = pMVar2;
          local_280 = pMVar2;
          if (local_768.allocator == (Allocator *)0x0) {
            if (local_768.data != (void *)0x0) {
              free(local_768.data);
            }
          }
          else {
            (*(local_768.allocator)->_vptr_Allocator[3])(local_768.allocator,local_768.data);
          }
        }
      }
      pMVar2->data = (void *)0x0;
      pMVar2->elemsize = 0;
      pMVar2->elempack = 0;
      pMVar2->dims = 0;
      pMVar2->w = 0;
      pMVar2->h = 0;
      pMVar2->d = 0;
      pMVar2->c = 0;
      pMVar2->cstep = 0;
      pMVar2->refcount = (int *)0x0;
    }
  }
  local_9a9 = true;
  if (local_530->data != (void *)0x0) {
    local_9a9 = local_530->cstep * (long)local_530->c == 0;
  }
  if (local_9a9) {
    local_514 = -100;
  }
  else {
    local_514 = 0;
  }
  return local_514;
}

Assistant:

int ExpandDims::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    bool _expand_w = false;
    bool _expand_h = false;
    bool _expand_d = false;
    bool _expand_c = false;

    if (axes.empty())
    {
        _expand_w = expand_w;
        _expand_h = expand_h;
        _expand_d = expand_d;
        _expand_c = expand_c;
    }
    else
    {
        const int* axes_ptr = axes;
        for (int i = 0; i < axes.w; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + 1 + axis;

            if (dims == 1 && axis == 0)
            {
                _expand_h = true;
            }
            if (dims == 1 && axis == 1)
            {
                _expand_w = true;
            }
            if (dims == 2 && axis == 0)
            {
                _expand_c = true;
            }
            if (dims == 2 && axis == 1)
            {
                _expand_h = true;
            }
            if (dims == 2 && axis == 2)
            {
                _expand_w = true;
            }
            if (dims == 3 && axis == 0)
            {
                _expand_c = true;
            }
            if (dims == 3 && axis == 1)
            {
                _expand_d = true;
            }
            if (dims == 3 && axis == 2)
            {
                _expand_h = true;
            }
            if (dims == 3 && axis == 3)
            {
                _expand_w = true;
            }
        }
    }

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (_expand_w && _expand_h)
        {
            top_blob = bottom_blob.reshape(1, w, 1, opt.blob_allocator);
        }
        else if (_expand_w)
        {
            top_blob = bottom_blob.reshape(1, w, opt.blob_allocator);
        }
        else if (_expand_h)
        {
            top_blob = bottom_blob.reshape(w, 1, opt.blob_allocator);
        }
    }

    if (dims == 2)
    {
        if (_expand_w)
        {
            top_blob = bottom_blob.reshape(1, w, h, opt.blob_allocator);
        }
        else if (_expand_h)
        {
            top_blob = bottom_blob.reshape(w, 1, h, opt.blob_allocator);
        }
        else if (_expand_c)
        {
            top_blob = bottom_blob.reshape(w, h, 1, opt.blob_allocator);
        }
    }

    if (dims == 3)
    {
        if (_expand_w)
        {
            top_blob = bottom_blob.reshape(1, w, h, channels, opt.blob_allocator);
        }
        else if (_expand_h)
        {
            top_blob = bottom_blob.reshape(w, 1, h, channels, opt.blob_allocator);
        }
        else if (_expand_d)
        {
            top_blob = bottom_blob.reshape(w, h, 1, channels, opt.blob_allocator);
        }
        else if (_expand_c)
        {
            top_blob = bottom_blob.reshape(w, h, channels, 1, opt.blob_allocator);
        }
    }

    if (top_blob.empty())
        return -100;

    return 0;
}